

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O1

char * __thiscall expr_tree::strerror_abi_cxx11_(expr_tree *this,int __errnum)

{
  undefined4 uVar1;
  char *pcVar2;
  undefined4 in_register_00000034;
  char *pcVar3;
  
  uVar1 = *(undefined4 *)(CONCAT44(in_register_00000034,__errnum) + 0x68);
  this->root_ = (expr_node *)&(this->parameters_).m_data_;
  switch(uVar1) {
  case 1:
    pcVar3 = "error: zero power of zero term detected";
    pcVar2 = "";
    break;
  case 2:
    pcVar3 = "error: division by zero detected";
    pcVar2 = "";
    break;
  case 3:
    pcVar3 = "error: logarithm of a negative number";
    pcVar2 = "";
    break;
  case 4:
    pcVar3 = "error: logarithm of zero";
    pcVar2 = "";
    break;
  default:
    pcVar3 = "semantic error";
    pcVar2 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)this,pcVar3,pcVar2);
  return (char *)this;
}

Assistant:

std::string expr_tree::strerror()
{
    switch (errno_)
    {
    case T_ZERO_PWR:
        return "error: zero power of zero term detected";
    case T_ZERO_DIVIZION:
        return "error: division by zero detected";
    case T_LOG_ZERO:
        return "error: logarithm of zero";
    case T_NEGATIVE_ARG:
        return "error: logarithm of a negative number";
    default:
        return "semantic error";
        break;
    }
}